

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

iterator anon_unknown.dwarf_18c225::findByName<VulkanHppGenerator::EnumValueData>
                   (vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                    *values,string *name)

{
  int iVar1;
  size_t in_RCX;
  void *in_RDX;
  
  if ((string *)values != name) {
    do {
      if ((((EnumValueData *)values)->name)._M_string_length == in_RCX) {
        if (in_RCX == 0) {
          return (iterator)(EnumValueData *)values;
        }
        iVar1 = bcmp((((EnumValueData *)values)->name)._M_dataplus._M_p,in_RDX,in_RCX);
        if (iVar1 == 0) {
          return (iterator)(EnumValueData *)values;
        }
      }
      values = (vector<VulkanHppGenerator::EnumValueData,_std::allocator<VulkanHppGenerator::EnumValueData>_>
                *)((long)values + 0xb0);
    } while ((string *)values != name);
  }
  return (iterator)(EnumValueData *)values;
}

Assistant:

typename std::vector<T>::iterator findByName( std::vector<T> & values, std::string const & name )
  {
    return std::ranges::find_if( values, [&name]( T const & value ) { return value.name == name; } );
  }